

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

void calc_sum_sse_wd32_avx2
               (uint8_t *src,uint8_t *ref,__m256i set_one_minusone,__m256i *sse_8x16,
               __m256i *sum_8x16)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  __m256i diff1;
  __m256i diff0;
  __m256i u_high_256;
  __m256i u_low_256;
  __m256i r00_256;
  __m256i s00_256;
  
  auVar3 = vpunpcklbw_avx2(*in_RDI,*in_RSI);
  auVar2 = vpunpckhbw_avx2(*in_RDI,*in_RSI);
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar4._16_8_ = in_YMM0_H;
  auVar4._24_8_ = in_register_00001218;
  auVar3 = vpmaddubsw_avx2(auVar3,auVar4);
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = in_XMM0_Qa;
  auVar1._16_8_ = in_YMM0_H;
  auVar1._24_8_ = in_register_00001218;
  auVar1 = vpmaddubsw_avx2(auVar2,auVar1);
  auVar2 = vpmaddwd_avx2(auVar3,auVar3);
  auVar2 = vpaddd_avx2(*in_RDX,auVar2);
  *in_RDX = auVar2;
  auVar2 = vpmaddwd_avx2(auVar1,auVar1);
  auVar2 = vpaddd_avx2(in_RDX[1],auVar2);
  in_RDX[1] = auVar2;
  auVar2 = vpaddw_avx2(*in_RCX,auVar3);
  *in_RCX = auVar2;
  auVar2 = vpaddw_avx2(in_RCX[1],auVar1);
  in_RCX[1] = auVar2;
  return;
}

Assistant:

static inline void calc_sum_sse_wd32_avx2(const uint8_t *src,
                                          const uint8_t *ref,
                                          __m256i set_one_minusone,
                                          __m256i sse_8x16[2],
                                          __m256i sum_8x16[2]) {
  const __m256i s00_256 = _mm256_loadu_si256((__m256i const *)(src));
  const __m256i r00_256 = _mm256_loadu_si256((__m256i const *)(ref));

  const __m256i u_low_256 = _mm256_unpacklo_epi8(s00_256, r00_256);
  const __m256i u_high_256 = _mm256_unpackhi_epi8(s00_256, r00_256);

  const __m256i diff0 = _mm256_maddubs_epi16(u_low_256, set_one_minusone);
  const __m256i diff1 = _mm256_maddubs_epi16(u_high_256, set_one_minusone);

  sse_8x16[0] = _mm256_add_epi32(sse_8x16[0], _mm256_madd_epi16(diff0, diff0));
  sse_8x16[1] = _mm256_add_epi32(sse_8x16[1], _mm256_madd_epi16(diff1, diff1));
  sum_8x16[0] = _mm256_add_epi16(sum_8x16[0], diff0);
  sum_8x16[1] = _mm256_add_epi16(sum_8x16[1], diff1);
}